

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_d3d_light.cxx
# Opt level: O0

void __thiscall xray_re::d3d_light::save(d3d_light *this,xr_writer *w)

{
  xr_writer *w_local;
  d3d_light *this_local;
  
  xr_writer::w_u32(w,this->type);
  xr_writer::w_fcolor(w,&this->diffuse);
  xr_writer::w_fcolor(w,&this->specular);
  xr_writer::w_fcolor(w,&this->ambient);
  xr_writer::w_float(w,this->range);
  xr_writer::w_float(w,this->falloff);
  xr_writer::w_float(w,this->attenuation0);
  xr_writer::w_float(w,this->attenuation1);
  xr_writer::w_float(w,this->attenuation2);
  xr_writer::w_float(w,this->theta);
  xr_writer::w_float(w,this->phi);
  return;
}

Assistant:

void d3d_light::save(xr_writer& w) const
{
	w.w_u32(type);
	w.w_fcolor(diffuse);
	w.w_fcolor(specular);
	w.w_fcolor(ambient);
	w.w_float(range);
	w.w_float(falloff);
	w.w_float(attenuation0);
	w.w_float(attenuation1);
	w.w_float(attenuation2);
	w.w_float(theta);
	w.w_float(phi);
}